

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Executor * __thiscall kj::EventLoop::getExecutor(EventLoop *this)

{
  Own<kj::Executor,_std::nullptr_t> *this_00;
  Badge<kj::EventLoop> local_49;
  Own<kj::Executor,_std::nullptr_t> *local_28;
  Own<kj::Executor,_std::nullptr_t> *e;
  Own<kj::Executor,_std::nullptr_t> *_e1850;
  EventLoop *this_local;
  
  _e1850 = (Own<kj::Executor,_std::nullptr_t> *)this;
  local_28 = kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor);
  e = local_28;
  if (local_28 == (Own<kj::Executor,_std::nullptr_t> *)0x0) {
    Badge<kj::EventLoop>::Badge(&local_49);
    atomicRefcounted<kj::_::ExecutorImpl,kj::EventLoop&,kj::Badge<kj::EventLoop>>
              ((kj *)&stack0xffffffffffffffb8,this,&local_49);
    Own<kj::Executor,decltype(nullptr)>::Own<kj::_::ExecutorImpl,void>
              ((Own<kj::Executor,decltype(nullptr)> *)&stack0xffffffffffffffc8,
               (Own<kj::_::ExecutorImpl,_std::nullptr_t> *)&stack0xffffffffffffffb8);
    this_00 = Maybe<kj::Own<kj::Executor,_std::nullptr_t>_>::emplace
                        (&this->executor,
                         (Own<kj::Executor,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    this_local = (EventLoop *)Own<kj::Executor,_std::nullptr_t>::operator*(this_00);
    Own<kj::Executor,_std::nullptr_t>::~Own
              ((Own<kj::Executor,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    Own<kj::_::ExecutorImpl,_std::nullptr_t>::~Own
              ((Own<kj::_::ExecutorImpl,_std::nullptr_t> *)&stack0xffffffffffffffb8);
  }
  else {
    this_local = (EventLoop *)Own<kj::Executor,_std::nullptr_t>::operator*(local_28);
  }
  return (Executor *)this_local;
}

Assistant:

const Executor& EventLoop::getExecutor() {
  KJ_IF_SOME(e, executor) {
    return *e;
  } else {
    return *executor.emplace(kj::atomicRefcounted<_::ExecutorImpl>(*this, Badge<EventLoop>()));
  }
}